

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

uint Abc_TtCanonicize(word *pTruth,int nVars,char *pCanonPerm)

{
  ulong uVar1;
  char cVar2;
  word wVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int w;
  uint nWords;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  byte bVar28;
  int iVar29;
  int iVar30;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  uint *puVar35;
  word *pwVar36;
  uint uVar37;
  ulong uVar38;
  uint uVar39;
  long lVar40;
  uint uVar41;
  word *pwVar42;
  ulong uVar43;
  ulong uVar44;
  undefined1 auVar45 [16];
  int iVar48;
  undefined1 auVar46 [16];
  int iVar49;
  undefined1 auVar47 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar58 [16];
  uint uCanonPhase;
  int pStoreIn [17];
  uint local_9c;
  ulong local_98;
  long local_90;
  ulong local_88;
  undefined8 local_80;
  uint local_78 [6];
  int aiStack_60 [12];
  
  uVar44 = (ulong)(uint)nVars;
  uVar39 = 1 << ((byte)(nVars + -6) & 0x1f);
  nWords = 1;
  if (6 < nVars) {
    nWords = uVar39;
  }
  if (0x10 < nVars) {
    __assert_fail("nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauCanon.c"
                  ,0x1e2,"unsigned int Abc_TtSemiCanonicize(word *, int, char *, int *)");
  }
  if (0 < nVars) {
    lVar34 = uVar44 - 1;
    auVar46._8_4_ = (int)lVar34;
    auVar46._0_8_ = lVar34;
    auVar46._12_4_ = (int)((ulong)lVar34 >> 0x20);
    auVar46 = auVar46 ^ _DAT_007ee2e0;
    iVar30 = auVar46._0_4_;
    iVar29 = auVar46._4_4_;
    iVar48 = auVar46._8_4_;
    iVar49 = auVar46._12_4_;
    auVar50._0_4_ = -(uint)(iVar29 == -0x80000000);
    auVar50._4_4_ = -(uint)(iVar29 == -0x80000000);
    auVar50._8_4_ = -(uint)(iVar49 == -0x80000000);
    auVar50._12_4_ = -(uint)(iVar49 == -0x80000000);
    auVar58._4_4_ = -(uint)(iVar30 < -0x80000000);
    auVar58._0_4_ = -(uint)(iVar30 < -0x80000000);
    auVar58._8_4_ = -(uint)(iVar48 < -0x7fffffff);
    auVar58._12_4_ = -(uint)(iVar48 < -0x7fffffff);
    auVar50 = auVar50 & auVar58;
    auVar58 = pshuflw(in_XMM4,auVar50,0xe8);
    auVar51._8_4_ = 0xffffffff;
    auVar51._0_8_ = 0xffffffffffffffff;
    auVar51._12_4_ = 0xffffffff;
    auVar58 = packssdw(auVar58 ^ auVar51,auVar58 ^ auVar51);
    if ((auVar58 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *pCanonPerm = '\0';
    }
    auVar51 = packssdw(auVar50,auVar50);
    auVar5._8_4_ = 0xffffffff;
    auVar5._0_8_ = 0xffffffffffffffff;
    auVar5._12_4_ = 0xffffffff;
    auVar51 = packssdw(auVar51 ^ auVar5,auVar51 ^ auVar5);
    auVar51 = packsswb(auVar51,auVar51);
    if ((auVar51._0_4_ >> 8 & 1) != 0) {
      pCanonPerm[1] = '\x01';
    }
    auVar52._0_4_ = -(uint)(iVar29 == -0x80000000);
    auVar52._4_4_ = -(uint)(iVar29 == -0x80000000);
    auVar52._8_4_ = -(uint)(iVar49 == -0x80000000);
    auVar52._12_4_ = -(uint)(iVar49 == -0x80000000);
    auVar6._4_4_ = -(uint)(iVar30 < -0x7ffffffe);
    auVar6._0_4_ = -(uint)(iVar30 < -0x7ffffffe);
    auVar6._8_4_ = -(uint)(iVar48 < -0x7ffffffd);
    auVar6._12_4_ = -(uint)(iVar48 < -0x7ffffffd);
    auVar52 = auVar52 & auVar6;
    auVar58 = packssdw(auVar58,auVar52);
    auVar7._8_4_ = 0xffffffff;
    auVar7._0_8_ = 0xffffffffffffffff;
    auVar7._12_4_ = 0xffffffff;
    auVar58 = packssdw(auVar58 ^ auVar7,auVar58 ^ auVar7);
    auVar58 = packsswb(auVar58,auVar58);
    if ((auVar58._0_4_ >> 0x10 & 1) != 0) {
      pCanonPerm[2] = '\x02';
    }
    auVar51 = pshufhw(auVar52,auVar52,0x84);
    auVar8._8_4_ = 0xffffffff;
    auVar8._0_8_ = 0xffffffffffffffff;
    auVar8._12_4_ = 0xffffffff;
    auVar51 = packssdw(auVar51 ^ auVar8,auVar51 ^ auVar8);
    auVar51 = packsswb(auVar51,auVar51);
    if ((auVar51._0_4_ >> 0x18 & 1) != 0) {
      pCanonPerm[3] = '\x03';
    }
    auVar53._0_4_ = -(uint)(iVar29 == -0x80000000);
    auVar53._4_4_ = -(uint)(iVar29 == -0x80000000);
    auVar53._8_4_ = -(uint)(iVar49 == -0x80000000);
    auVar53._12_4_ = -(uint)(iVar49 == -0x80000000);
    auVar9._4_4_ = -(uint)(iVar30 < -0x7ffffffc);
    auVar9._0_4_ = -(uint)(iVar30 < -0x7ffffffc);
    auVar9._8_4_ = -(uint)(iVar48 < -0x7ffffffb);
    auVar9._12_4_ = -(uint)(iVar48 < -0x7ffffffb);
    auVar53 = auVar53 & auVar9;
    auVar58 = pshuflw(auVar58,auVar53,0xe8);
    auVar10._8_4_ = 0xffffffff;
    auVar10._0_8_ = 0xffffffffffffffff;
    auVar10._12_4_ = 0xffffffff;
    auVar58 = packssdw(auVar58 ^ auVar10,auVar58 ^ auVar10);
    auVar58 = packsswb(auVar58,auVar58);
    if ((auVar58 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      pCanonPerm[4] = '\x04';
    }
    auVar51 = packssdw(auVar53,auVar53);
    auVar11._8_4_ = 0xffffffff;
    auVar11._0_8_ = 0xffffffffffffffff;
    auVar11._12_4_ = 0xffffffff;
    auVar51 = packssdw(auVar51 ^ auVar11,auVar51 ^ auVar11);
    auVar51 = packsswb(auVar51,auVar51);
    if ((auVar51._4_2_ >> 8 & 1) != 0) {
      pCanonPerm[5] = '\x05';
    }
    auVar54._0_4_ = -(uint)(iVar29 == -0x80000000);
    auVar54._4_4_ = -(uint)(iVar29 == -0x80000000);
    auVar54._8_4_ = -(uint)(iVar49 == -0x80000000);
    auVar54._12_4_ = -(uint)(iVar49 == -0x80000000);
    auVar12._4_4_ = -(uint)(iVar30 < -0x7ffffffa);
    auVar12._0_4_ = -(uint)(iVar30 < -0x7ffffffa);
    auVar12._8_4_ = -(uint)(iVar48 < -0x7ffffff9);
    auVar12._12_4_ = -(uint)(iVar48 < -0x7ffffff9);
    auVar54 = auVar54 & auVar12;
    auVar58 = packssdw(auVar58,auVar54);
    auVar13._8_4_ = 0xffffffff;
    auVar13._0_8_ = 0xffffffffffffffff;
    auVar13._12_4_ = 0xffffffff;
    auVar58 = packssdw(auVar58 ^ auVar13,auVar58 ^ auVar13);
    auVar58 = packsswb(auVar58,auVar58);
    if ((auVar58 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      pCanonPerm[6] = '\x06';
    }
    auVar51 = pshufhw(auVar54,auVar54,0x84);
    auVar14._8_4_ = 0xffffffff;
    auVar14._0_8_ = 0xffffffffffffffff;
    auVar14._12_4_ = 0xffffffff;
    auVar51 = packssdw(auVar51 ^ auVar14,auVar51 ^ auVar14);
    auVar51 = packsswb(auVar51,auVar51);
    if ((auVar51._6_2_ >> 8 & 1) != 0) {
      pCanonPerm[7] = '\a';
    }
    auVar55._0_4_ = -(uint)(iVar29 == -0x80000000);
    auVar55._4_4_ = -(uint)(iVar29 == -0x80000000);
    auVar55._8_4_ = -(uint)(iVar49 == -0x80000000);
    auVar55._12_4_ = -(uint)(iVar49 == -0x80000000);
    auVar15._4_4_ = -(uint)(iVar30 < -0x7ffffff8);
    auVar15._0_4_ = -(uint)(iVar30 < -0x7ffffff8);
    auVar15._8_4_ = -(uint)(iVar48 < -0x7ffffff7);
    auVar15._12_4_ = -(uint)(iVar48 < -0x7ffffff7);
    auVar55 = auVar55 & auVar15;
    auVar58 = pshuflw(auVar58,auVar55,0xe8);
    auVar16._8_4_ = 0xffffffff;
    auVar16._0_8_ = 0xffffffffffffffff;
    auVar16._12_4_ = 0xffffffff;
    auVar58 = packssdw(auVar58 ^ auVar16,auVar58 ^ auVar16);
    auVar58 = packsswb(auVar58,auVar58);
    if ((auVar58 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pCanonPerm[8] = '\b';
    }
    auVar51 = packssdw(auVar55,auVar55);
    auVar17._8_4_ = 0xffffffff;
    auVar17._0_8_ = 0xffffffffffffffff;
    auVar17._12_4_ = 0xffffffff;
    auVar51 = packssdw(auVar51 ^ auVar17,auVar51 ^ auVar17);
    auVar51 = packsswb(auVar51,auVar51);
    if ((auVar51._8_2_ >> 8 & 1) != 0) {
      pCanonPerm[9] = '\t';
    }
    auVar56._0_4_ = -(uint)(iVar29 == -0x80000000);
    auVar56._4_4_ = -(uint)(iVar29 == -0x80000000);
    auVar56._8_4_ = -(uint)(iVar49 == -0x80000000);
    auVar56._12_4_ = -(uint)(iVar49 == -0x80000000);
    auVar18._4_4_ = -(uint)(iVar30 < -0x7ffffff6);
    auVar18._0_4_ = -(uint)(iVar30 < -0x7ffffff6);
    auVar18._8_4_ = -(uint)(iVar48 < -0x7ffffff5);
    auVar18._12_4_ = -(uint)(iVar48 < -0x7ffffff5);
    auVar56 = auVar56 & auVar18;
    auVar58 = packssdw(auVar58,auVar56);
    auVar19._8_4_ = 0xffffffff;
    auVar19._0_8_ = 0xffffffffffffffff;
    auVar19._12_4_ = 0xffffffff;
    auVar58 = packssdw(auVar58 ^ auVar19,auVar58 ^ auVar19);
    auVar58 = packsswb(auVar58,auVar58);
    if ((auVar58 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      pCanonPerm[10] = '\n';
    }
    auVar51 = pshufhw(auVar56,auVar56,0x84);
    auVar20._8_4_ = 0xffffffff;
    auVar20._0_8_ = 0xffffffffffffffff;
    auVar20._12_4_ = 0xffffffff;
    auVar51 = packssdw(auVar51 ^ auVar20,auVar51 ^ auVar20);
    auVar51 = packsswb(auVar51,auVar51);
    if ((auVar51._10_2_ >> 8 & 1) != 0) {
      pCanonPerm[0xb] = '\v';
    }
    auVar57._0_4_ = -(uint)(iVar29 == -0x80000000);
    auVar57._4_4_ = -(uint)(iVar29 == -0x80000000);
    auVar57._8_4_ = -(uint)(iVar49 == -0x80000000);
    auVar57._12_4_ = -(uint)(iVar49 == -0x80000000);
    auVar21._4_4_ = -(uint)(iVar30 < -0x7ffffff4);
    auVar21._0_4_ = -(uint)(iVar30 < -0x7ffffff4);
    auVar21._8_4_ = -(uint)(iVar48 < -0x7ffffff3);
    auVar21._12_4_ = -(uint)(iVar48 < -0x7ffffff3);
    auVar57 = auVar57 & auVar21;
    auVar58 = pshuflw(auVar58,auVar57,0xe8);
    auVar22._8_4_ = 0xffffffff;
    auVar22._0_8_ = 0xffffffffffffffff;
    auVar22._12_4_ = 0xffffffff;
    auVar58 = packssdw(auVar58 ^ auVar22,auVar58 ^ auVar22);
    auVar58 = packsswb(auVar58,auVar58);
    if ((auVar58 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      pCanonPerm[0xc] = '\f';
    }
    auVar58 = packssdw(auVar57,auVar57);
    auVar23._8_4_ = 0xffffffff;
    auVar23._0_8_ = 0xffffffffffffffff;
    auVar23._12_4_ = 0xffffffff;
    auVar58 = packssdw(auVar58 ^ auVar23,auVar58 ^ auVar23);
    auVar58 = packsswb(auVar58,auVar58);
    if ((auVar58._12_2_ >> 8 & 1) != 0) {
      pCanonPerm[0xd] = '\r';
    }
    auVar45._0_4_ = -(uint)(DAT_0087b1d0._4_4_ == iVar29);
    auVar45._4_4_ = -(uint)(DAT_0087b1d0._4_4_ == iVar29);
    auVar45._8_4_ = -(uint)(DAT_0087b1d0._12_4_ == iVar49);
    auVar45._12_4_ = -(uint)(DAT_0087b1d0._12_4_ == iVar49);
    auVar24._4_4_ = -(uint)(iVar30 < (int)DAT_0087b1d0);
    auVar24._0_4_ = -(uint)(iVar30 < (int)DAT_0087b1d0);
    auVar24._8_4_ = -(uint)(iVar48 < DAT_0087b1d0._8_4_);
    auVar24._12_4_ = -(uint)(iVar48 < DAT_0087b1d0._8_4_);
    auVar45 = auVar45 & auVar24;
    auVar58 = packssdw(_DAT_0087b1d0,auVar45);
    auVar47._8_4_ = 0xffffffff;
    auVar47._0_8_ = 0xffffffffffffffff;
    auVar47._12_4_ = 0xffffffff;
    auVar58 = packssdw(auVar58 ^ auVar47,auVar58 ^ auVar47);
    auVar58 = packsswb(auVar58,auVar58);
    if ((auVar58 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      pCanonPerm[0xe] = '\x0e';
    }
    auVar58 = pshufhw(auVar45,auVar45,0x84);
    auVar58 = packssdw(auVar58 ^ auVar47,auVar58 ^ auVar47);
    auVar58 = packsswb(auVar58,auVar58);
    if ((auVar58._14_2_ >> 8 & 1) != 0) {
      pCanonPerm[0xf] = '\x0f';
    }
  }
  local_98 = (ulong)nWords;
  if ((int)nWords < 1) {
    uVar37 = 0;
    uVar41 = 0;
    uVar25 = 0;
    if ((int)nWords < 0) goto LAB_0049a2e8;
  }
  else {
    uVar26 = 0;
    uVar37 = 0;
    do {
      uVar31 = pTruth[uVar26];
      if (uVar31 != 0) {
        uVar31 = uVar31 - (uVar31 >> 1 & 0x5555555555555555);
        uVar31 = (uVar31 >> 2 & 0x3333333333333333) + (uVar31 & 0x3333333333333333);
        uVar31 = (uVar31 >> 4) + uVar31 & 0xf0f0f0f0f0f0f0f;
        uVar31 = (uVar31 >> 8) + uVar31;
        lVar34 = (uVar31 >> 0x10) + uVar31;
        uVar37 = uVar37 + ((int)((ulong)lVar34 >> 0x20) + (int)lVar34 & 0xffU);
      }
      uVar26 = uVar26 + 1;
    } while (local_98 != uVar26);
    uVar41 = 0;
    if ((int)(nWords * 0x20) < (int)uVar37) {
      uVar26 = 0;
      do {
        pTruth[uVar26] = ~pTruth[uVar26];
        uVar26 = uVar26 + 1;
        uVar25 = uVar37;
      } while (local_98 != uVar26);
LAB_0049a2e8:
      uVar37 = nWords * 0x40 - uVar25;
      uVar41 = 1 << ((byte)nVars & 0x1f);
    }
  }
  local_90 = (long)nVars;
  uVar26 = uVar44;
  local_88 = uVar44;
  if (nVars < 7) {
    if (nVars < 1) {
      local_78[local_90] = uVar37;
      goto LAB_0049a801;
    }
    uVar26 = *pTruth;
    puVar35 = local_78;
    lVar34 = 0;
    do {
      uVar31 = *(ulong *)((long)s_Truths6Neg + lVar34) & uVar26;
      uVar31 = uVar31 - (uVar31 >> 1 & 0x5555555555555555);
      uVar31 = (uVar31 >> 2 & 0x3333333333333333) + (uVar31 & 0x3333333333333333);
      uVar31 = (uVar31 >> 4) + uVar31 & 0xf0f0f0f0f0f0f0f;
      uVar31 = (uVar31 >> 8) + uVar31;
      lVar40 = (uVar31 >> 0x10) + uVar31;
      *puVar35 = (int)((ulong)lVar40 >> 0x20) + (int)lVar40 & 0xff;
      lVar34 = lVar34 + 8;
      puVar35 = puVar35 + 1;
    } while (uVar44 * 8 - lVar34 != 0);
LAB_0049a5ad:
    local_78[local_90] = uVar37;
    uVar26 = local_88;
    if ((int)local_88 < 1) goto LAB_0049a801;
    local_80 = local_90 + -2;
  }
  else {
    memset(local_78,0,uVar44 * 4);
    if (nVars + -6 != 0x1f) {
      lVar34 = 0;
      do {
        uVar26 = pTruth[lVar34];
        uVar31 = pTruth[lVar34 + 1];
        pwVar36 = s_Truths6Neg;
        lVar40 = 0;
        do {
          uVar43 = (*pwVar36 & uVar31) << ((byte)(1 << ((byte)lVar40 & 0x1f)) & 0x3f) |
                   *pwVar36 & uVar26;
          if (uVar43 != 0) {
            uVar43 = uVar43 - (uVar43 >> 1 & 0x5555555555555555);
            uVar43 = (uVar43 >> 2 & 0x3333333333333333) + (uVar43 & 0x3333333333333333);
            uVar43 = (uVar43 >> 4) + uVar43 & 0xf0f0f0f0f0f0f0f;
            uVar43 = (uVar43 >> 8) + uVar43;
            lVar32 = (uVar43 >> 0x10) + uVar43;
            local_78[lVar40] =
                 local_78[lVar40] + ((int)((ulong)lVar32 >> 0x20) + (int)lVar32 & 0xffU);
          }
          lVar40 = lVar40 + 1;
          pwVar36 = pwVar36 + 1;
        } while (lVar40 != 6);
        if (uVar26 != 0) {
          uVar26 = uVar26 - (uVar26 >> 1 & 0x5555555555555555);
          uVar26 = (uVar26 >> 2 & 0x3333333333333333) + (uVar26 & 0x3333333333333333);
          uVar26 = (uVar26 >> 4) + uVar26 & 0xf0f0f0f0f0f0f0f;
          uVar26 = (uVar26 >> 8) + uVar26;
          lVar40 = (uVar26 >> 0x10) + uVar26;
          lVar32 = 0;
          do {
            if (((uint)lVar34 >> ((uint)lVar32 & 0x1f) & 1) == 0) {
              aiStack_60[lVar32] =
                   aiStack_60[lVar32] + ((int)((ulong)lVar40 >> 0x20) + (int)lVar40 & 0xffU);
            }
            lVar32 = lVar32 + 1;
          } while (uVar44 - 6 != lVar32);
        }
        if (uVar31 != 0) {
          uVar31 = uVar31 - (uVar31 >> 1 & 0x5555555555555555);
          uVar26 = (uVar31 >> 2 & 0x3333333333333333) + (uVar31 & 0x3333333333333333);
          uVar26 = (uVar26 >> 4) + uVar26 & 0xf0f0f0f0f0f0f0f;
          uVar26 = (uVar26 >> 8) + uVar26;
          lVar40 = (uVar26 >> 0x10) + uVar26;
          lVar32 = 0;
          do {
            if ((((uint)lVar34 | 1) >> ((uint)lVar32 & 0x1f) & 1) == 0) {
              aiStack_60[lVar32] =
                   aiStack_60[lVar32] + ((int)((ulong)lVar40 >> 0x20) + (int)lVar40 & 0xffU);
            }
            lVar32 = lVar32 + 1;
          } while (uVar44 - 6 != lVar32);
        }
        lVar34 = lVar34 + 2;
      } while (lVar34 < (int)uVar39);
      goto LAB_0049a5ad;
    }
    local_78[uVar44] = uVar37;
    local_80 = 0x23;
    uVar44 = 0x25;
  }
  uVar31 = 0;
  do {
    uVar39 = uVar37 - local_78[uVar31];
    if ((int)local_78[uVar31] < (int)uVar39) {
      if (nWords == 1) {
        bVar28 = (byte)(1 << ((byte)uVar31 & 0x1f));
        *pTruth = (s_Truths6[uVar31] & *pTruth) >> (bVar28 & 0x3f) |
                  *pTruth << (bVar28 & 0x3f) & s_Truths6[uVar31];
      }
      else if (uVar31 < 6) {
        if (0 < (int)nWords) {
          uVar26 = s_Truths6[uVar31];
          uVar43 = 0;
          do {
            bVar28 = (byte)(1 << ((byte)uVar31 & 0x1f));
            pTruth[uVar43] =
                 (pTruth[uVar43] & uVar26) >> (bVar28 & 0x3f) |
                 pTruth[uVar43] << (bVar28 & 0x3f) & uVar26;
            uVar43 = uVar43 + 1;
          } while (local_98 != uVar43);
        }
      }
      else if (0 < (int)nWords) {
        bVar28 = (byte)(uVar31 - 6);
        uVar25 = 1 << (bVar28 & 0x1f);
        iVar30 = 2 << (bVar28 & 0x1f);
        uVar26 = 1;
        if (1 < (int)uVar25) {
          uVar26 = (ulong)uVar25;
        }
        pwVar42 = pTruth + (int)uVar25;
        pwVar36 = pTruth;
        do {
          if (uVar31 - 6 != 0x1f) {
            uVar43 = 0;
            do {
              wVar3 = pwVar36[uVar43];
              pwVar36[uVar43] = pwVar42[uVar43];
              pwVar42[uVar43] = wVar3;
              uVar43 = uVar43 + 1;
            } while (uVar26 != uVar43);
          }
          pwVar36 = pwVar36 + iVar30;
          pwVar42 = pwVar42 + iVar30;
        } while (pwVar36 < pTruth + (int)nWords);
      }
      uVar41 = uVar41 | 1 << ((uint)uVar31 & 0x1f);
      local_78[uVar31] = uVar39;
      uVar26 = local_88;
    }
    uVar31 = uVar31 + 1;
  } while (uVar31 != uVar44);
  iVar30 = (int)uVar26;
  if (1 < iVar30) {
    uVar43 = 2;
    uVar31 = 0;
    do {
      uVar1 = uVar31 + 1;
      if ((long)uVar31 < local_80) {
        uVar27 = uVar43;
        uVar38 = uVar1 & 0xffffffff;
        do {
          uVar33 = uVar27 & 0xffffffff;
          if ((int)local_78[(int)uVar38] <= (int)local_78[uVar27]) {
            uVar33 = uVar38;
          }
          uVar27 = uVar27 + 1;
          iVar29 = (int)uVar33;
          uVar38 = uVar33;
        } while (uVar44 != uVar27);
      }
      else {
        iVar29 = (int)uVar1;
      }
      uVar39 = local_78[uVar31];
      uVar25 = local_78[iVar29];
      if ((int)uVar25 < (int)uVar39) {
        cVar2 = pCanonPerm[uVar31];
        pCanonPerm[uVar31] = pCanonPerm[iVar29];
        pCanonPerm[iVar29] = cVar2;
        local_78[uVar31] = uVar25;
        local_78[iVar29] = uVar39;
        uVar41 = uVar41 ^ (1 << ((byte)iVar29 & 0x1f) ^ 1 << ((uint)uVar31 & 0x1f)) &
                          -((uVar41 >> ((byte)iVar29 & 0x1f) ^ uVar41 >> ((byte)uVar31 & 0x1f)) & 1)
        ;
        Abc_TtSwapVars(pTruth,iVar30,(uint)uVar31,iVar29);
      }
      uVar43 = uVar43 + 1;
      uVar31 = uVar1;
    } while (uVar1 != iVar30 - 1);
  }
LAB_0049a801:
  local_98 = (ulong)((int)uVar26 - 2) + 1;
  iVar30 = 0;
  uVar44 = uVar26;
  local_9c = uVar41;
  while( true ) {
    if ((int)uVar44 < 2) {
      return local_9c;
    }
    uVar39 = 0;
    uVar31 = local_98;
    do {
      uVar25 = *(uint *)((long)&local_80 + uVar31 * 4 + 4);
      if (uVar25 == local_78[uVar31]) {
        uVar25 = Abc_TtCofactorPerm(pTruth,(int)uVar31 + -1,nWords,
                                    (uint)(uVar25 != (int)local_78[local_90] / 2),pCanonPerm,
                                    &local_9c,1);
        uVar39 = uVar39 | uVar25;
      }
      lVar34 = uVar31 + -1;
      bVar4 = 0 < (long)uVar31;
      uVar31 = lVar34;
    } while (lVar34 != 0 && bVar4);
    if (uVar39 == 0) {
      return local_9c;
    }
    if ((int)uVar44 < 3) {
      return local_9c;
    }
    uVar25 = 0;
    uVar44 = 1;
    uVar39 = local_78[1];
    do {
      uVar37 = local_78[uVar44 + 1];
      if (uVar39 == uVar37) {
        uVar39 = Abc_TtCofactorPerm(pTruth,(int)uVar44,nWords,
                                    (uint)(uVar39 != (int)local_78[local_90] / 2),pCanonPerm,
                                    &local_9c,1);
        uVar25 = uVar25 | uVar39;
      }
      uVar44 = uVar44 + 1;
      uVar39 = uVar37;
    } while ((int)uVar26 - 1 != uVar44);
    if (uVar25 == 0) break;
    iVar30 = iVar30 + 1;
    uVar44 = local_88;
    if (iVar30 == 5) {
      return local_9c;
    }
  }
  return local_9c;
}

Assistant:

unsigned Abc_TtCanonicize( word * pTruth, int nVars, char * pCanonPerm )
{
    int pStoreIn[17];
    unsigned uCanonPhase;
    int i, k, nWords = Abc_TtWordNum( nVars );
    int fNaive = 1;

#ifdef CANON_VERIFY
    char pCanonPermCopy[16];
    static word pCopy1[1024];
    static word pCopy2[1024];
    Abc_TtCopy( pCopy1, pTruth, nWords, 0 );
#endif

    uCanonPhase = Abc_TtSemiCanonicize( pTruth, nVars, pCanonPerm, pStoreIn );
    for ( k = 0; k < 5; k++ )
    {
        int fChanges = 0;
        for ( i = nVars - 2; i >= 0; i-- )
            if ( pStoreIn[i] == pStoreIn[i+1] )
                fChanges |= Abc_TtCofactorPerm( pTruth, i, nWords, pStoreIn[i] != pStoreIn[nVars]/2, pCanonPerm, &uCanonPhase, fNaive );
        if ( !fChanges )
            break;
        fChanges = 0;
        for ( i = 1; i < nVars - 1; i++ )
            if ( pStoreIn[i] == pStoreIn[i+1] )
                fChanges |= Abc_TtCofactorPerm( pTruth, i, nWords, pStoreIn[i] != pStoreIn[nVars]/2, pCanonPerm, &uCanonPhase, fNaive );
        if ( !fChanges )
            break;
    }

#ifdef CANON_VERIFY
    Abc_TtCopy( pCopy2, pTruth, nWords, 0 );
    memcpy( pCanonPermCopy, pCanonPerm, sizeof(char) * nVars );
    Abc_TtImplementNpnConfig( pCopy2, nVars, pCanonPermCopy, uCanonPhase );
    if ( !Abc_TtEqual( pCopy1, pCopy2, nWords ) )
        printf( "Canonical form verification failed!\n" );
#endif
/*
    if ( !Abc_TtEqual( pCopy1, pCopy2, nWords ) )
    {
        Kit_DsdPrintFromTruth( pCopy1, nVars ); printf( "\n" );
        Kit_DsdPrintFromTruth( pCopy2, nVars ); printf( "\n" );
        i = 0;
    }
*/
    return uCanonPhase;
}